

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

string * set_xterm256_foreground_abi_cxx11_(int r,int g,int b)

{
  ostream *poVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  string *in_RDI;
  ostringstream oss;
  int x;
  ostringstream local_190 [376];
  int local_18;
  
  local_18 = rgb2xterm256(in_ESI,in_EDX,in_ECX);
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"\x1b[38;5;");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  std::operator<<(poVar1,"m");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

static std::string set_xterm256_foreground(int r, int g, int b) {
    int x = rgb2xterm256(r, g, b);
    std::ostringstream oss;
    oss << "\033[38;5;" << x << "m";
    return oss.str();
}